

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::setTriple(Triple *this,Twine *Str)

{
  Triple local_50;
  Twine *local_18;
  Twine *Str_local;
  Triple *this_local;
  
  local_18 = Str;
  Str_local = (Twine *)this;
  Triple(&local_50,Str);
  operator=(this,&local_50);
  ~Triple(&local_50);
  return;
}

Assistant:

void Triple::setTriple(const Twine &Str) {
  *this = Triple(Str);
}